

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O1

void __thiscall icu_63::FCDUTF8CollationIterator::switchToBackward(FCDUTF8CollationIterator *this)

{
  int iVar1;
  int32_t iVar2;
  State SVar3;
  
  SVar3 = CHECK_BWD;
  if (this->state != IN_FCD_SEGMENT) {
    if (this->state == CHECK_FWD) {
      iVar1 = (this->super_UTF8CollationIterator).pos;
      this->limit = iVar1;
      SVar3 = (iVar1 != this->start) + CHECK_BWD;
    }
    else {
      iVar2 = this->start;
      (this->super_UTF8CollationIterator).pos = iVar2;
      this->limit = iVar2;
    }
  }
  this->state = SVar3;
  return;
}

Assistant:

void
FCDUTF8CollationIterator::switchToBackward() {
    U_ASSERT(state == CHECK_FWD ||
             (state == IN_FCD_SEGMENT && pos == start) ||
             (state >= IN_NORMALIZED && pos == 0));
    if(state == CHECK_FWD) {
        // Turn around from forward checking.
        limit = pos;
        if(pos == start) {
            state = CHECK_BWD;  // Check backward.
        } else {  // pos > start
            state = IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the start of the FCD segment.
        if(state == IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it backward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking backward from it.
            limit = pos = start;
        }
        state = CHECK_BWD;
    }
}